

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PackageExportAllDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PackageExportAllDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5)

{
  Token star1;
  Token doubleColon;
  Token star2;
  Token semi;
  PackageExportAllDeclarationSyntax *pPVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_R8;
  long in_R9;
  Token *in_stack_00000008;
  size_t in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  BumpAllocator *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff68;
  
  pPVar1 = (PackageExportAllDeclarationSyntax *)
           allocate(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  star1.info = (Info *)pPVar1;
  star1.kind = (short)in_stack_ffffffffffffff68;
  star1._2_1_ = (char)((ulong)in_stack_ffffffffffffff68 >> 0x10);
  star1.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff68 >> 0x18);
  star1.rawLen = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  doubleColon.info = (Info *)*in_R8;
  doubleColon._0_8_ = *(undefined8 *)(in_R9 + 8);
  star2.info = (Info *)*in_RCX;
  star2._0_8_ = in_R8[1];
  semi.info = (Info *)*in_RDX;
  semi._0_8_ = in_RCX[1];
  slang::syntax::PackageExportAllDeclarationSyntax::PackageExportAllDeclarationSyntax
            ((PackageExportAllDeclarationSyntax *)in_stack_00000008->info,
             *(SyntaxList<slang::syntax::AttributeInstanceSyntax> **)in_stack_00000008,
             *in_stack_00000008,star1,doubleColon,star2,semi);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }